

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_kernel_2.h
# Opt level: O0

void __thiscall
dlib::sequence_kernel_2<dlib::document_handler_*,_dlib::memory_manager_stateless_kernel_1<char>_>::
move_to_pos(sequence_kernel_2<dlib::document_handler_*,_dlib::memory_manager_stateless_kernel_1<char>_>
            *this,node **current_node,unsigned_long *current_pos,unsigned_long pos,
           unsigned_long size)

{
  unsigned_long left_1;
  unsigned_long right_1;
  unsigned_long left;
  unsigned_long right;
  unsigned_long size_local;
  unsigned_long pos_local;
  unsigned_long *current_pos_local;
  node **current_node_local;
  sequence_kernel_2<dlib::document_handler_*,_dlib::memory_manager_stateless_kernel_1<char>_>
  *this_local;
  
  if (pos < *current_pos) {
    right = (size + pos) - *current_pos;
    left = *current_pos - pos;
    *current_pos = pos;
    if (left < right) {
      for (; left != 0; left = left - 1) {
        *current_node = (*current_node)->left;
      }
    }
    else {
      for (; right != 0; right = right - 1) {
        *current_node = (*current_node)->right;
      }
    }
  }
  else if (*current_pos != pos) {
    right_1 = pos - *current_pos;
    left_1 = (size - pos) + *current_pos;
    *current_pos = pos;
    if (left_1 < right_1) {
      for (; left_1 != 0; left_1 = left_1 - 1) {
        *current_node = (*current_node)->left;
      }
    }
    else {
      for (; right_1 != 0; right_1 = right_1 - 1) {
        *current_node = (*current_node)->right;
      }
    }
  }
  return;
}

Assistant:

void sequence_kernel_2<T,mem_manager>::
    move_to_pos (
        node*& current_node,
        unsigned long& current_pos,
        unsigned long pos,
        unsigned long size
    ) const
    {
        if ( current_pos > pos)
        {
            // number of hops in each direction needed to reach pos
            unsigned long right = size + pos - current_pos;
            unsigned long left = current_pos - pos;
            current_pos = pos;

            if (left < right)
            {
                // move left to position pos
                for (; left > 0; --left)
                    current_node = current_node->left;
            }
            else
            {
                // move left to position pos
                for (; right > 0; --right)
                    current_node = current_node->right;
            }
        }
        else if (current_pos != pos)
        {
            // number of hops in each direction needed to reach pos
            unsigned long right = pos - current_pos;
            unsigned long left = size - pos + current_pos;
            current_pos = pos;

            if (left < right)
            {
                // move left to position pos
                for (; left > 0; --left)
                    current_node = current_node->left;
            }
            else
            {
                // move left to position pos
                for (; right > 0; --right)
                    current_node = current_node->right;
            }
        }
    }